

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O1

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
postfixExpression(Tokenizer *tokenizer)

{
  long lVar1;
  int64_t value;
  undefined8 uVar2;
  int iVar3;
  Token *pTVar4;
  ExpressionFunctionHandler *this;
  Token *pTVar5;
  ExpressionInternal *pEVar6;
  _List_node_base *p_Var7;
  Tokenizer *in_RSI;
  optional<ExpressionFunctionHandle> oVar8;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  parameters;
  undefined1 local_78 [32];
  vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  local_58;
  undefined8 local_38;
  
  pTVar4 = Tokenizer::peekToken(in_RSI,0);
  if ((pTVar4->type == Identifier) &&
     (pTVar4 = Tokenizer::peekToken(in_RSI,1), pTVar4->type == LParen)) {
    this = ExpressionFunctionHandler::instance();
    pTVar4 = Tokenizer::peekToken(in_RSI,0);
    if (*(__index_type *)
         ((long)&(pTVar4->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') goto LAB_00145577;
    oVar8 = ExpressionFunctionHandler::find(this,(Identifier *)&pTVar4->value);
    if (((undefined1  [16])
         oVar8.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
         super__Optional_payload_base<ExpressionFunctionHandle> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      pTVar4 = Tokenizer::nextToken(in_RSI);
      if (*(__index_type *)
           ((long)&(pTVar4->value).
                   super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .
                   super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
           + 0x20) == '\x04') {
        Tokenizer::eatTokens(in_RSI,1);
        local_58.
        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.
        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while( true ) {
          pTVar5 = Tokenizer::peekToken(in_RSI,0);
          if (pTVar5->type == RParen) {
            Tokenizer::eatTokens(in_RSI,1);
            pEVar6 = (ExpressionInternal *)operator_new(0x50);
            local_78._0_8_ =
                 local_58.
                 super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_78._8_8_ =
                 local_58.
                 super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_78._16_8_ =
                 local_58.
                 super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_58.
            super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_58.
            super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_58.
            super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ExpressionInternal::ExpressionInternal
                      (pEVar6,(Identifier *)&pTVar4->value,
                       (vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        *)local_78);
            (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
            super__List_node_base._M_next = (_List_node_base *)pEVar6;
            std::
            vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ::~vector((vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                       *)local_78);
            goto LAB_00145533;
          }
          if ((local_58.
               super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               local_58.
               super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) &&
             (pTVar5 = Tokenizer::nextToken(in_RSI), pTVar5->type != Comma)) break;
          expression((Tokenizer *)local_78);
          uVar2 = local_78._0_8_;
          if ((ExpressionInternal *)local_78._0_8_ == (ExpressionInternal *)0x0) {
            (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
            super__List_node_base._M_next = (_List_node_base *)0x0;
          }
          else {
            std::
            vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>
            ::
            emplace_back<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                      ((vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>
                        *)&local_58,
                       (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                       local_78);
          }
          std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                    ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                     local_78);
          if ((ExpressionInternal *)uVar2 == (ExpressionInternal *)0x0) {
LAB_00145533:
            std::
            vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ::~vector(&local_58);
            return (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)
                   tokenizer;
          }
        }
        (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
        super__List_node_base._M_next = (_List_node_base *)0x0;
        goto LAB_00145533;
      }
      goto LAB_00145577;
    }
  }
  pTVar4 = Tokenizer::peekToken(in_RSI,0);
  switch(pTVar4->type) {
  case Identifier:
    if (*(__index_type *)
         ((long)&(pTVar4->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
LAB_00145577:
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    Tokenizer::eatTokens(in_RSI,1);
    if ((*(long *)((long)&(pTVar4->value).
                          super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                  + 8) == 1) &&
       (iVar3 = bcmp(*(void **)&(pTVar4->value).
                                super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                ._M_u,".",1), iVar3 == 0)) {
      p_Var7 = (_List_node_base *)operator_new(0x50);
      *(undefined4 *)&p_Var7->_M_next = 5;
      p_Var7->_M_prev = (_List_node_base *)0x0;
      p_Var7[1]._M_next = (_List_node_base *)0x0;
      *(_List_node_base **)((long)(p_Var7 + 1) + 8) = (_List_node_base *)0x0;
      *(undefined1 *)&p_Var7[4]._M_next = 0;
      (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
      super__List_node_base._M_next = p_Var7;
      return (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)tokenizer;
    }
    pEVar6 = (ExpressionInternal *)operator_new(0x50);
    local_78._0_8_ = (long)local_78 + 0x10;
    lVar1 = *(long *)&(pTVar4->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      ._M_u;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,lVar1,
               *(long *)((long)&(pTVar4->value).
                                super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        + 8) + lVar1);
    ExpressionInternal::ExpressionInternal(pEVar6,(Identifier *)local_78);
    break;
  case Integer:
    Tokenizer::eatTokens(in_RSI,1);
    if (*(__index_type *)
         ((long)&(pTVar4->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x01') {
      __assert_fail("std::holds_alternative<int64_t>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x59,"int64_t Token::intValue() const");
    }
    value = *(int64_t *)
             &(pTVar4->value).
              super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              _M_u;
    pEVar6 = (ExpressionInternal *)operator_new(0x50);
    ExpressionInternal::ExpressionInternal(pEVar6,value);
    goto LAB_001454b3;
  case String:
    Tokenizer::eatTokens(in_RSI,1);
    if (*(__index_type *)
         ((long)&(pTVar4->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x03') {
      __assert_fail("std::holds_alternative<StringLiteral>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x53,"const StringLiteral &Token::stringValue() const");
    }
    pEVar6 = (ExpressionInternal *)operator_new(0x50);
    local_78._0_8_ = local_78 + 0x10;
    lVar1 = *(long *)&(pTVar4->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      ._M_u;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,lVar1,
               *(long *)((long)&(pTVar4->value).
                                super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        + 8) + lVar1);
    ExpressionInternal::ExpressionInternal(pEVar6,(StringLiteral *)local_78);
    break;
  case Float:
    Tokenizer::eatTokens(in_RSI,1);
    if (*(__index_type *)
         ((long)&(pTVar4->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x02') {
      __assert_fail("std::holds_alternative<double>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x5f,"double Token::floatValue() const");
    }
    local_38 = *(undefined8 *)
                &(pTVar4->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                 ._M_u;
    pEVar6 = (ExpressionInternal *)operator_new(0x50);
    ExpressionInternal::ExpressionInternal(pEVar6,(double)local_38);
LAB_001454b3:
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)pEVar6;
    return (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)tokenizer;
  case LParen:
    Tokenizer::eatTokens(in_RSI,1);
    expression((Tokenizer *)local_78);
    pTVar4 = Tokenizer::nextToken(in_RSI);
    if (pTVar4->type == RParen) {
      (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)local_78._0_8_;
      local_78._0_8_ = (ExpressionInternal *)0x0;
    }
    else {
      (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)0x0;
    }
    std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
              ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_78)
    ;
    return (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)tokenizer;
  default:
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
    return (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)tokenizer;
  }
  (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)pEVar6;
  if (local_78._0_8_ != (long)local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> postfixExpression(Tokenizer& tokenizer)
{
	if (tokenizer.peekToken(0).type == TokenType::Identifier &&
		tokenizer.peekToken(1).type == TokenType::LParen &&
		ExpressionFunctionHandler::instance().find(tokenizer.peekToken(0).identifierValue()))
	{
		const Identifier &functionName = tokenizer.nextToken().identifierValue();
		tokenizer.eatToken();

		std::vector<std::unique_ptr<ExpressionInternal>> parameters;
		while (tokenizer.peekToken().type != TokenType::RParen)
		{
			if (parameters.size() != 0 && tokenizer.nextToken().type != TokenType::Comma)
				return nullptr;

			std::unique_ptr<ExpressionInternal> exp = expression(tokenizer);
			if (exp == nullptr)
				return nullptr;

			parameters.push_back(std::move(exp));
		}

		tokenizer.eatToken();

		return std::make_unique<ExpressionInternal>(functionName, std::move(parameters));
	}

	return primaryExpression(tokenizer);
}